

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_global.c
# Opt level: O3

int configAssign(mpt_config *cfg,mpt_path *path,mpt_value *val)

{
  mpt_metatype *pmVar1;
  int iVar2;
  mpt_node *pmVar3;
  mpt_node **base;
  mpt_node *pmVar4;
  
  if (path == (mpt_path *)0x0) {
    iVar2 = -1;
  }
  else {
    if (cfg[3]._vptr == (_mpt_vptr_config *)0x0) {
      base = &nodeGlobal;
      pmVar3 = nodeGlobal;
      pmVar4 = (mpt_node *)0x0;
    }
    else {
      pmVar3 = make_global((mpt_path *)(cfg + 1));
      if (pmVar3 == (mpt_node *)0x0) {
        return -4;
      }
      base = &pmVar3->children;
      pmVar4 = (mpt_node *)0x0;
      if (pmVar3->children == (mpt_node *)0x0) {
        pmVar4 = pmVar3;
      }
    }
    if (path->len == 0) {
      if (cfg[3]._vptr != (_mpt_vptr_config *)0x0) {
        iVar2 = mpt_meta_set(&pmVar3->_meta,val);
        return iVar2;
      }
      iVar2 = -2;
    }
    else {
      pmVar3 = mpt_node_assign(base,path,val);
      if (pmVar3 == (mpt_node *)0x0) {
        iVar2 = (uint)(val == (mpt_value *)0x0) * 4 + -4;
      }
      else {
        if (pmVar4 != (mpt_node *)0x0) {
          pmVar4->children->parent = pmVar4;
        }
        pmVar1 = pmVar3->_meta;
        if (pmVar1 != (mpt_metatype *)0x0) {
          iVar2 = (*(pmVar1->_vptr->convertable).convert)((mpt_convertable *)pmVar1,0,(void *)0x0);
          return iVar2;
        }
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int configAssign(MPT_INTERFACE(config) *cfg, const MPT_STRUCT(path) *path, const MPT_STRUCT(value) *val)
{
	MPT_STRUCT(configRoot) *c = MPT_baseaddr(configRoot, cfg, _cfg);
	MPT_INTERFACE(metatype) *mt;
	MPT_STRUCT(node) **b, *n, *t;
	
	if (!path) {
		return MPT_ERROR(BadArgument);
	}
	n = nodeGlobal;
	b = &nodeGlobal;
	t = 0;
	
	/* get/create config base node */
	if (c->base.len) {
		if (!(n = make_global(&c->base))) {
			return MPT_ERROR(BadOperation);
		}
		t = n->children ? 0 : n;
		b = &n->children;
	}
	/* top level element */
	if (!path->len) {
		if (!c->base.len) {
			return MPT_ERROR(BadValue);
		}
		return mpt_meta_set(&n->_meta, val);
	}
	/* set subelement */
	if (!(n = mpt_node_assign(b, path, val))) {
		return val ? MPT_ERROR(BadOperation) : 0;
	}
	if (t) {
		t->children->parent = t;
	}
	mt = n->_meta;
	
	/* return data type identifier */
	return mt ? MPT_metatype_convert(mt, 0, 0) : 0;
}